

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteResult.h
# Opt level: O3

void __thiscall
oout::SuiteResult::SuiteResult<oout::SuccessResult,oout::FailureResult,oout::ErrorResult>
          (SuiteResult *this,shared_ptr<oout::SuccessResult> *tests,
          shared_ptr<oout::FailureResult> *tests_1,shared_ptr<oout::ErrorResult> *tests_2)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Result>_> __l;
  undefined8 uStack_60;
  shared_ptr<const_oout::Result> local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_28;
  
  local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((tests->super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Result;
  local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (tests->super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (tests_1->super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40 = (tests_1->super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_38 = (tests_2->super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30 = (tests_2->super___shared_ptr<oout::ErrorResult,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = &local_58;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  list((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)&local_28,__l,(allocator_type *)((long)&uStack_60 + 7));
  SuiteResult(this,(list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                    *)&local_28);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  ::_M_clear(&local_28);
  lVar1 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar1) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_60 + lVar1));
    }
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit SuiteResult(const std::shared_ptr<T> & ... tests)
		: SuiteResult(std::list<std::shared_ptr<const Result>>{
			tests...
		})
	{
	}